

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O0

void secp256k1_hsort(void *ptr,size_t count,size_t size,_func_int_void_ptr_void_ptr_void_ptr *cmp,
                    void *cmp_data)

{
  uchar *puVar1;
  size_t in_RCX;
  size_t in_RDX;
  uchar *in_RSI;
  size_t in_R8;
  size_t i;
  size_t in_stack_00000038;
  size_t in_stack_00000040;
  size_t in_stack_00000048;
  uchar *in_stack_00000050;
  uchar *local_30;
  
  for (local_30 = (uchar *)((ulong)in_RSI >> 1); puVar1 = in_RSI, local_30 != (uchar *)0x0;
      local_30 = (uchar *)((long)local_30 - 1)) {
    secp256k1_heap_down(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                        (_func_int_void_ptr_void_ptr_void_ptr *)ptr,(void *)count);
  }
  while (local_30 = puVar1, (uchar *)0x1 < local_30) {
    secp256k1_heap_swap(in_RSI,in_RDX,in_RCX,in_R8);
    secp256k1_heap_down(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                        (_func_int_void_ptr_void_ptr_void_ptr *)ptr,(void *)count);
    puVar1 = local_30 + -1;
  }
  return;
}

Assistant:

static void secp256k1_hsort(void *ptr, size_t count, size_t size,
                            int (*cmp)(const void *, const void *, void *),
                            void *cmp_data) {
    size_t i;

    for (i = count/2; 0 < i; --i) {
        secp256k1_heap_down(ptr, i-1, count, size, cmp, cmp_data);
    }
    for (i = count; 1 < i; --i) {
        /* Extract the largest value from the heap */
        secp256k1_heap_swap(ptr, 0, i-1, size);

        /* Repair the heap condition */
        secp256k1_heap_down(ptr, 0, i-1, size, cmp, cmp_data);
    }
}